

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O1

void lj_err_throw(lua_State *L,int errcode)

{
  uint *puVar1;
  code *pcVar2;
  ulong uVar3;
  ulong *puVar4;
  
  uVar3 = (ulong)(L->glref).ptr32;
  puVar1 = (uint *)(uVar3 + 0x254);
  *puVar1 = *puVar1 & 0xffffffef;
  *(undefined4 *)(uVar3 + 0xf4) = 0;
  L->status = '\0';
  puVar4 = (ulong *)__tls_get_addr(&PTR_00166fa0);
  *puVar4 = (long)errcode | 0x4c55414a49543200;
  puVar4[1] = 0;
  _Unwind_RaiseException();
  pcVar2 = *(code **)((ulong)(L->glref).ptr32 + 0xe0);
  if (pcVar2 != (code *)0x0) {
    (*pcVar2)(L);
  }
  exit(1);
}

Assistant:

LJ_FASTCALL lj_err_throw(lua_State *L, int errcode)
{
  global_State *g = G(L);
  lj_trace_abort(g);
  setgcrefnull(g->jit_L);
  L->status = 0;
#if LJ_UNWIND_EXT
  err_raise_ext(errcode);
  /*
  ** A return from this function signals a corrupt C stack that cannot be
  ** unwound. We have no choice but to call the panic function and exit.
  **
  ** Usually this is caused by a C function without unwind information.
  ** This should never happen on x64, but may happen if you've manually
  ** enabled LUAJIT_UNWIND_EXTERNAL and forgot to recompile *every*
  ** non-C++ file with -funwind-tables.
  */
  if (G(L)->panic)
    G(L)->panic(L);
#else
  {
    void *cf = err_unwind(L, NULL, errcode);
    if (cframe_unwind_ff(cf))
      lj_vm_unwind_ff(cframe_raw(cf));
    else
      lj_vm_unwind_c(cframe_raw(cf), errcode);
  }
#endif
  exit(EXIT_FAILURE);
}